

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

void __thiscall CHuffman::ConstructTree(CHuffman *this,uint *pFrequencies)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  long lVar9;
  long lVar10;
  CHuffmanConstructNode *pCVar11;
  CHuffmanConstructNode *pCVar12;
  long in_FS_OFFSET;
  code *pcStack_1048;
  CHuffmanConstructNode *pCStack_1040;
  CHuffmanConstructNode *apNodesLeft [257];
  CHuffmanConstructNode aNodesLeftStorage [257];
  
  apNodesLeft[5] = (CHuffmanConstructNode *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_aNodes[0].m_NumBits = 0xffffffff;
  this->m_aNodes[0].m_aLeafs[0] = 0xffff;
  this->m_aNodes[0].m_aLeafs[1] = 0xffff;
  this->m_aNodes[0].m_Symbol = '\0';
  puVar8 = &this->m_aNodes[1].m_Symbol;
  apNodesLeft[0x100] = aNodesLeftStorage;
  lVar5 = 0;
  do {
    aNodesLeftStorage[lVar5].m_Frequency = pFrequencies[lVar5];
    aNodesLeftStorage[lVar5].m_NodeId = (unsigned_short)lVar5;
    apNodesLeft[lVar5] = apNodesLeft[0x100];
    lVar5 = lVar5 + 1;
    *(undefined8 *)(puVar8 + -8) = 0xffffffffffffffff;
    *puVar8 = (uchar)lVar5;
    apNodesLeft[0x100] = apNodesLeft[0x100] + 1;
    puVar8 = puVar8 + 0x10;
  } while (lVar5 != 0x100);
  aNodesLeftStorage[0x100].m_Frequency = 1;
  aNodesLeftStorage[0x100].m_NodeId = 0x100;
  lVar4 = 0x101;
  lVar6 = 0x100;
  lVar9 = 0x101;
  lVar5 = lVar9;
  lVar7 = lVar6;
LAB_001c1e72:
  do {
    if (1 < (int)lVar9) {
      lVar9 = lVar9 + -1;
      lVar10 = 0;
      bVar3 = false;
      pCVar11 = apNodesLeft[0];
      do {
        pCVar12 = apNodesLeft[lVar10 + 1];
        if (pCVar11->m_Frequency < pCVar12->m_Frequency) {
          apNodesLeft[lVar10] = pCVar12;
          apNodesLeft[lVar10 + 1] = pCVar11;
          bVar3 = true;
          pCVar12 = pCVar11;
        }
        lVar10 = lVar10 + 1;
        pCVar11 = pCVar12;
      } while (lVar6 != lVar10);
      lVar6 = lVar6 + -1;
      if (bVar3) goto LAB_001c1e72;
    }
    this->m_aNodes[lVar4].m_NumBits = 0;
    pCVar11 = apNodesLeft[lVar5 + -1];
    this->m_aNodes[lVar4].m_aLeafs[0] = pCVar11->m_NodeId;
    pcVar2 = (&pcStack_1048)[lVar5];
    lVar9 = lVar5 + -1;
    this->m_aNodes[lVar4].m_aLeafs[1] = *(unsigned_short *)pcVar2;
    *(short *)pcVar2 = (short)lVar4;
    *(int *)(pcVar2 + 4) = *(int *)(pcVar2 + 4) + pCVar11->m_Frequency;
    lVar4 = lVar4 + 1;
    lVar6 = lVar7 + -1;
    lVar5 = lVar9;
    lVar7 = lVar6;
    if (lVar4 == 0x201) {
      this->m_NumNodes = 0x201;
      this->m_pStartNode = this->m_aNodes + 0x200;
      pCStack_1040 = (CHuffmanConstructNode *)0x1c1f26;
      Setbits_r(this,this->m_aNodes + 0x200,0,0);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        pCStack_1040 = (CHuffmanConstructNode *)Init;
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void CHuffman::ConstructTree(const unsigned *pFrequencies)
{
	CHuffmanConstructNode aNodesLeftStorage[HUFFMAN_MAX_SYMBOLS];
	CHuffmanConstructNode *apNodesLeft[HUFFMAN_MAX_SYMBOLS];
	int NumNodesLeft = HUFFMAN_MAX_SYMBOLS;

	// add the symbols
	for(int i = 0; i < HUFFMAN_MAX_SYMBOLS; i++)
	{
		m_aNodes[i].m_NumBits = 0xFFFFFFFF;
		m_aNodes[i].m_Symbol = i;
		m_aNodes[i].m_aLeafs[0] = 0xffff;
		m_aNodes[i].m_aLeafs[1] = 0xffff;

		if(i == HUFFMAN_EOF_SYMBOL)
			aNodesLeftStorage[i].m_Frequency = 1;
		else
			aNodesLeftStorage[i].m_Frequency = pFrequencies[i];
		aNodesLeftStorage[i].m_NodeId = i;
		apNodesLeft[i] = &aNodesLeftStorage[i];

	}

	m_NumNodes = HUFFMAN_MAX_SYMBOLS;

	// construct the table
	while(NumNodesLeft > 1)
	{
		// we can't rely on stdlib's qsort for this, it can generate different results on different implementations
		BubbleSort(apNodesLeft, NumNodesLeft);

		m_aNodes[m_NumNodes].m_NumBits = 0;
		m_aNodes[m_NumNodes].m_aLeafs[0] = apNodesLeft[NumNodesLeft-1]->m_NodeId;
		m_aNodes[m_NumNodes].m_aLeafs[1] = apNodesLeft[NumNodesLeft-2]->m_NodeId;
		apNodesLeft[NumNodesLeft-2]->m_NodeId = m_NumNodes;
		apNodesLeft[NumNodesLeft-2]->m_Frequency = apNodesLeft[NumNodesLeft-1]->m_Frequency + apNodesLeft[NumNodesLeft-2]->m_Frequency;

		m_NumNodes++;
		NumNodesLeft--;
	}

	// set start node
	m_pStartNode = &m_aNodes[m_NumNodes-1];

	// build symbol bits
	Setbits_r(m_pStartNode, 0, 0);
}